

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

ON_SubDSectorId ON_SubDSectorId::Create(ON_SubDVertex *vertex,ON_SubDFace *face)

{
  ushort uVar1;
  ON_SubDSectorId OVar2;
  bool bVar3;
  uint face_vertex_index;
  uint uVar4;
  ON_SubDVertex *pOVar5;
  ulong uVar6;
  ulong uVar7;
  ON_SubDSectorId *local_160;
  ON_SubDEdge *e_1;
  unsigned_short vei;
  ON_SubDFace *f_2;
  ON_SubDFace *pOStack_118;
  uint crease_count;
  ON_SubDFace *f_1;
  ON_SubDFace *f;
  ON_SubDSectorIterator sit1;
  ON_SubDSectorIterator sit0;
  ON_SubDComponentPtr local_70;
  ON_SubDEdge *local_68;
  ON_SubDEdge *e [2];
  ON_SubDComponentPtrPair pair;
  uint local_40;
  short local_3c;
  bool bIsDart;
  uint expected_crease_count;
  unsigned_short crease_face_count;
  unsigned_short n;
  uint face_vi;
  ON_SubDSectorId sid;
  ON_SubDFace *face_local;
  ON_SubDVertex *vertex_local;
  uint uStack_10;
  uint local_c;
  
  sid._4_8_ = face;
  ON_SubDSectorId((ON_SubDSectorId *)&crease_face_count);
  if (((sid._4_8_ == 0) && (vertex != (ON_SubDVertex *)0x0)) &&
     (bVar3 = ON_SubDVertex::IsSingleSectorVertex(vertex), bVar3)) {
    sid._4_8_ = ON_SubDVertex::Face(vertex,0);
  }
  if ((vertex == (ON_SubDVertex *)0x0) || (sid._4_8_ == 0)) {
    vertex_local._4_4_ = 0;
    uStack_10 = 0;
    local_c = 0xffffffff;
    goto LAB_008f8695;
  }
  if ((((vertex->super_ON_SubDComponentBase).m_id != 0) &&
      ((vertex->super_ON_SubDComponentBase).m_id != 0xffffffff)) &&
     ((*(int *)(sid._4_8_ + 8) != 0 &&
      ((((*(int *)(sid._4_8_ + 8) != -1 && (2 < *(ushort *)(sid._4_8_ + 0x9c))) &&
        (1 < vertex->m_edge_count)) &&
       ((vertex->m_face_count != 0 &&
        (face_vertex_index = ON_SubDFace::VertexIndex((ON_SubDFace *)sid._4_8_,vertex),
        face_vertex_index < *(ushort *)(sid._4_8_ + 0x9c))))))))) {
    _crease_face_count = (vertex->super_ON_SubDComponentBase).m_id;
    face_vi = *(uint *)(sid._4_8_ + 8);
    uVar1 = vertex->m_face_count;
    bVar3 = ON_SubDVertex::IsSmoothOrDart(vertex);
    if (bVar3) {
      if ((1 < uVar1) && (uVar1 == vertex->m_edge_count)) {
        bVar3 = ON_SubDVertex::IsDart(vertex);
        local_3c = 0;
        if (bVar3) {
          local_3c = 2;
        }
        local_40 = (uint)bVar3;
LAB_008f8435:
        if (sid.m_vertex_id == 0) {
          f_2._4_4_ = 0;
          for (e_1._6_2_ = 0; e_1._6_2_ < vertex->m_edge_count; e_1._6_2_ = e_1._6_2_ + 1) {
            uVar6 = vertex->m_edges[e_1._6_2_].m_ptr & 0xfffffffffffffff8;
            if ((uVar6 == 0) || (*(short *)(uVar6 + 100) == 0)) {
              vertex_local._4_4_ = Invalid.m_vertex_id;
              uStack_10 = Invalid.m_minimum_face_id;
              local_c = Invalid.m_sector_face_count;
              goto LAB_008f8695;
            }
            uVar7 = *(ulong *)(uVar6 + 0x68) & 0xfffffffffffffff8;
            if (uVar7 == 0) {
              vertex_local._4_4_ = Invalid.m_vertex_id;
              uStack_10 = Invalid.m_minimum_face_id;
              local_c = Invalid.m_sector_face_count;
              goto LAB_008f8695;
            }
            if (*(uint *)(uVar7 + 8) < face_vi) {
              face_vi = *(uint *)(uVar7 + 8);
            }
            if (*(char *)(uVar6 + 0x60) == '\x02') {
              f_2._4_4_ = f_2._4_4_ + 1;
              if (local_40 < f_2._4_4_) {
                vertex_local._4_4_ = Invalid.m_vertex_id;
                uStack_10 = Invalid.m_minimum_face_id;
                local_c = Invalid.m_sector_face_count;
                goto LAB_008f8695;
              }
              if (local_3c != *(short *)(uVar6 + 100)) {
                vertex_local._4_4_ = Invalid.m_vertex_id;
                uStack_10 = Invalid.m_minimum_face_id;
                local_c = Invalid.m_sector_face_count;
                goto LAB_008f8695;
              }
              if (local_3c != 1) goto LAB_008f8594;
            }
            else {
LAB_008f8594:
              if (*(short *)(uVar6 + 100) != 2) {
                vertex_local._4_4_ = Invalid.m_vertex_id;
                uStack_10 = Invalid.m_minimum_face_id;
                local_c = Invalid.m_sector_face_count;
                goto LAB_008f8695;
              }
              uVar6 = *(ulong *)(uVar6 + 0x70) & 0xfffffffffffffff8;
              if (uVar6 == 0) {
                vertex_local._4_4_ = Invalid.m_vertex_id;
                uStack_10 = Invalid.m_minimum_face_id;
                local_c = Invalid.m_sector_face_count;
                goto LAB_008f8695;
              }
              if (*(uint *)(uVar6 + 8) < face_vi) {
                face_vi = *(uint *)(uVar6 + 8);
              }
            }
          }
          if (f_2._4_4_ == local_40) {
            sid.m_vertex_id = (uint)uVar1;
          }
        }
      }
    }
    else {
      bVar3 = ON_SubDVertex::IsCreaseOrCorner(vertex);
      if (bVar3) {
        if ((uVar1 + 1 == (uint)vertex->m_edge_count) &&
           (uVar4 = ON_SubDVertex::CreasedEdgeCount(vertex,true,true,true,false), uVar4 == 2)) {
          join_0x00000010_0x00000000_ = ON_SubDVertex::BoundaryEdgePair(vertex);
        }
        else {
          pair.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
          e[1] = (ON_SubDEdge *)ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
        }
        bVar3 = ON_SubDComponentPtrPair::BothAreNotNull((ON_SubDComponentPtrPair *)(e + 1));
        if (bVar3) {
          local_70 = ON_SubDComponentPtrPair::First((ON_SubDComponentPtrPair *)(e + 1));
          local_68 = ON_SubDComponentPtr::Edge(&local_70);
          sit0._64_8_ = ON_SubDComponentPtrPair::Second((ON_SubDComponentPtrPair *)(e + 1));
          e[0] = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&sit0.m_current_ring_index);
          if ((((local_68 != (ON_SubDEdge *)0x0) && (e[0] != (ON_SubDEdge *)0x0)) &&
              (local_68->m_face_count == 1)) && (e[0]->m_face_count == 1)) {
            local_3c = 1;
            local_40 = 2;
            goto LAB_008f8435;
          }
        }
        else {
          bVar3 = ON_SubDVertex::IsCrease(vertex);
          if ((bVar3) && (uVar1 != vertex->m_edge_count)) {
            vertex_local._4_4_ = Invalid.m_vertex_id;
            uStack_10 = Invalid.m_minimum_face_id;
            local_c = Invalid.m_sector_face_count;
            goto LAB_008f8695;
          }
          ON_SubDSectorIterator::ON_SubDSectorIterator
                    ((ON_SubDSectorIterator *)&sit1.m_current_ring_index);
          pOVar5 = ON_SubDSectorIterator::Initialize
                             ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,
                              (ON_SubDFace *)sid._4_8_,0,face_vertex_index);
          if (vertex != pOVar5) {
            vertex_local._4_4_ = Invalid.m_vertex_id;
            uStack_10 = Invalid.m_minimum_face_id;
            local_c = Invalid.m_sector_face_count;
            goto LAB_008f8695;
          }
          memcpy(&f,&sit1.m_current_ring_index,0x48);
          sid.m_vertex_id = 1;
          f_1 = ON_SubDSectorIterator::NextFace
                          ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,AnyCrease);
          while( true ) {
            bVar3 = false;
            if (f_1 != (ON_SubDFace *)0x0) {
              bVar3 = sid.m_vertex_id <= vertex->m_face_count;
            }
            if (!bVar3) break;
            sid.m_vertex_id = sid.m_vertex_id + 1;
            if ((f_1->super_ON_SubDComponentBase).m_id < face_vi) {
              face_vi = (f_1->super_ON_SubDComponentBase).m_id;
            }
            f_1 = ON_SubDSectorIterator::NextFace
                            ((ON_SubDSectorIterator *)&sit1.m_current_ring_index,AnyCrease);
          }
          pOStack_118 = ON_SubDSectorIterator::PrevFace((ON_SubDSectorIterator *)&f,AnyCrease);
          while( true ) {
            bVar3 = false;
            if (pOStack_118 != (ON_SubDFace *)0x0) {
              bVar3 = sid.m_vertex_id <= vertex->m_face_count;
            }
            if (!bVar3) break;
            sid.m_vertex_id = sid.m_vertex_id + 1;
            if ((pOStack_118->super_ON_SubDComponentBase).m_id < face_vi) {
              face_vi = (pOStack_118->super_ON_SubDComponentBase).m_id;
            }
            pOStack_118 = ON_SubDSectorIterator::PrevFace((ON_SubDSectorIterator *)&f,AnyCrease);
          }
        }
      }
    }
  }
  bVar3 = IsSet((ON_SubDSectorId *)&crease_face_count);
  if ((bVar3) && (sid.m_vertex_id <= vertex->m_face_count)) {
    local_160 = (ON_SubDSectorId *)&crease_face_count;
  }
  else {
    local_160 = &Invalid;
  }
  vertex_local._4_4_ = local_160->m_vertex_id;
  uStack_10 = local_160->m_minimum_face_id;
  local_c = local_160->m_sector_face_count;
LAB_008f8695:
  OVar2.m_sector_face_count = local_c;
  OVar2.m_vertex_id = vertex_local._4_4_;
  OVar2.m_minimum_face_id = uStack_10;
  return OVar2;
}

Assistant:

const ON_SubDSectorId ON_SubDSectorId::Create(
  const ON_SubDVertex* vertex,
  const ON_SubDFace* face
)
{
  ON_SubDSectorId sid;

  if (nullptr == face && nullptr != vertex && vertex->IsSingleSectorVertex())
    face = vertex->Face(0);

  if (nullptr == vertex || nullptr == face)
  {
    // Creation of ON_SubDSectorId::Invalid in opennurbs_statics.cpp or 
    // just another invalid input.
    sid.m_vertex_id = 0;
    sid.m_minimum_face_id = 0;
    sid.m_sector_face_count = 0xFFFFFFFFU;
    return sid;
  }

  for (;;)
  {
    if (vertex->m_id <= 0 || vertex->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_id <= 0 || face->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_edge_count < 3)
      break;
    if (vertex->m_edge_count < 2)
      break;
    if (vertex->m_face_count < 1)
      break;
    const unsigned face_vi = face->VertexIndex(vertex);
    if (face_vi >= face->m_edge_count)
      break;

    sid.m_vertex_id = vertex->m_id;
    sid.m_minimum_face_id = face->m_id;
    const unsigned short n = vertex->m_face_count;
    unsigned short crease_face_count = 0;
    unsigned int expected_crease_count = 0;
    if (vertex->IsSmoothOrDart())
    {
      if (n < 2 || n != vertex->m_edge_count)
        break;
      const bool bIsDart = vertex->IsDart();
      crease_face_count = bIsDart ? 2 : 0;
      expected_crease_count = bIsDart ? 1 : 0;
    }
    else if ( vertex->IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair pair 
        = (n + 1 == vertex->m_edge_count && 2==vertex->CreasedEdgeCount(true,true,true,false))
          ? vertex->BoundaryEdgePair()
          : ON_SubDComponentPtrPair::Null;
      if (pair.BothAreNotNull())
      {
        // we can avoid using a sector iterator
        const ON_SubDEdge* e[2] = { pair.First().Edge(),pair.Second().Edge() };
        if (nullptr == e[0] || nullptr == e[1])
          break;
        if (1 != e[0]->m_face_count || 1 != e[1]->m_face_count)
          break;
        crease_face_count = 1;
        expected_crease_count = 2;
      }
      else
      {
        if (vertex->IsCrease())
        {
          if (n != vertex->m_edge_count)
            return ON_SubDSectorId::Invalid;
        }

        // complicated case needs to use more time consuming sector iterator 
        ON_SubDSectorIterator sit0;
        if ( vertex != sit0.Initialize(face, 0, face_vi))
          return ON_SubDSectorId::Invalid;
        ON_SubDSectorIterator sit1(sit0);
        // advance sit0 until we hit a crease;
        sid.m_sector_face_count = 1;
        for (const ON_SubDFace* f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        // advance sit1 until we hit a crease;
        for (const ON_SubDFace* f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        break;
      }
    }
    else
    {
      break;
    }

    if (0 == sid.m_sector_face_count)
    {
      // we can avoid expensive sector iterator.
      unsigned int crease_count = 0;
      const ON_SubDFace* f;
      for (unsigned short vei = 0; vei < vertex->m_edge_count; ++vei)
      {
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
        if (nullptr == e || 0 == e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[0].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
        if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        {
          ++crease_count;
          if (crease_count > expected_crease_count)
            return ON_SubDSectorId::Invalid;
          if (crease_face_count != e->m_face_count)
            return ON_SubDSectorId::Invalid;
          if (1 == crease_face_count)
            continue;
        }
        if (2 != e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[1].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
      }
      if (crease_count == expected_crease_count)
        sid.m_sector_face_count = n;
    }
    break;
  }

  return (sid.IsSet() && sid.m_sector_face_count <= vertex->m_face_count) ? sid : ON_SubDSectorId::Invalid;
}